

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
FieldsAreMatcherImpl<const_nsh_cmd_&,_testing::internal::IndexSequence<0UL,_1UL>_>::
DescribeNegationTo(FieldsAreMatcherImpl<const_nsh_cmd_&,_testing::internal::IndexSequence<0UL,_1UL>_>
                   *this,ostream *os)

{
  ostream *poVar1;
  MatcherBase<nsh_status_(*const_&)(unsigned_int,_char_**)> *this_00;
  MatcherBase<const_char_(&)[16]> *this_01;
  char *local_30;
  char *local_28;
  char *local_20;
  char *separator;
  ostream *os_local;
  FieldsAreMatcherImpl<const_nsh_cmd_&,_testing::internal::IndexSequence<0UL,_1UL>_> *this_local;
  
  local_20 = "";
  separator = (char *)os;
  os_local = (ostream *)this;
  poVar1 = std::operator<<(os,"");
  poVar1 = std::operator<<(poVar1,"has field #");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1," that ");
  this_00 = &std::
             get<0ul,testing::Matcher<nsh_status(*const&)(unsigned_int,char**)>,testing::Matcher<char_const(&)[16]>>
                       (&this->matchers_)->
             super_MatcherBase<nsh_status_(*const_&)(unsigned_int,_char_**)>;
  MatcherBase<nsh_status_(*const_&)(unsigned_int,_char_**)>::DescribeNegationTo
            (this_00,(ostream *)separator);
  local_20 = ", or ";
  local_30 = ", or ";
  poVar1 = std::operator<<((ostream *)separator,", or ");
  poVar1 = std::operator<<(poVar1,"has field #");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1," that ");
  this_01 = &std::
             get<1ul,testing::Matcher<nsh_status(*const&)(unsigned_int,char**)>,testing::Matcher<char_const(&)[16]>>
                       (&this->matchers_)->super_MatcherBase<const_char_(&)[16]>;
  MatcherBase<const_char_(&)[16]>::DescribeNegationTo(this_01,(ostream *)separator);
  local_20 = ", or ";
  local_28 = ", or ";
  VariadicExpand<char_const*,2ul>((char *(*) [2])&local_30);
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    const char* separator = "";
    VariadicExpand({(*os << separator << "has field #" << I << " that ",
                     std::get<I>(matchers_).DescribeNegationTo(os),
                     separator = ", or ")...});
  }